

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  short sVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  ushort uVar5;
  uint *puVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  
  Align(this,other);
  sVar1 = other->exponent_;
  sVar2 = this->exponent_;
  sVar3 = other->used_bigits_;
  iVar8 = 0;
  if ((long)sVar3 < 1) {
    bVar10 = true;
    lVar7 = 0;
  }
  else {
    lVar4 = (long)sVar1 * 4 + (long)sVar2 * -4 + 4;
    lVar7 = 0;
    do {
      uVar9 = (iVar8 + *(int *)((long)this + lVar7 * 4 + lVar4)) - other->bigits_buffer_[lVar7];
      *(uint *)((long)this + lVar7 * 4 + lVar4) = uVar9 & 0xfffffff;
      iVar8 = (int)uVar9 >> 0x1f;
      lVar7 = lVar7 + 1;
    } while (sVar3 != lVar7);
    bVar10 = -1 < (int)uVar9;
  }
  if (!bVar10) {
    puVar6 = (uint *)((long)this + ((lVar7 + sVar1) - (long)sVar2) * 4);
    do {
      puVar6 = puVar6 + 1;
      uVar9 = *puVar6;
      *puVar6 = uVar9 - 1 & 0xfffffff;
    } while ((int)(uVar9 - 1) < 0);
  }
  uVar5 = this->used_bigits_;
  if (0 < (short)uVar5) {
    do {
      if (this->bigits_buffer_[(ulong)uVar5 - 1] != 0) goto LAB_00877910;
      this->used_bigits_ = uVar5 - 1;
      bVar10 = 1 < (short)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar10);
    uVar5 = 0;
  }
LAB_00877910:
  if (uVar5 == 0) {
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  DOUBLE_CONVERSION_ASSERT(LessEqual(other, *this));

  Align(other);

  const int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_bigits_; ++i) {
    DOUBLE_CONVERSION_ASSERT((borrow == 0) || (borrow == 1));
    const Chunk difference = RawBigit(i + offset) - other.RawBigit(i) - borrow;
    RawBigit(i + offset) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    const Chunk difference = RawBigit(i + offset) - borrow;
    RawBigit(i + offset) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}